

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDnsTlsAssociationRecord>::emplace<QDnsTlsAssociationRecord>
          (QMovableArrayOps<QDnsTlsAssociationRecord> *this,qsizetype i,
          QDnsTlsAssociationRecord *args)

{
  QDnsTlsAssociationRecord **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QDnsTlsAssociationRecord *pQVar4;
  long lVar5;
  QDnsTlsAssociationRecordPrivate *pQVar6;
  qsizetype qVar7;
  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*> __old_val;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_60;
  QDnsTlsAssociationRecord local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
           super_QArrayDataPointer<QDnsTlsAssociationRecord>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
        super_QArrayDataPointer<QDnsTlsAssociationRecord>.size == i) {
      qVar7 = QArrayDataPointer<QDnsTlsAssociationRecord>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDnsTlsAssociationRecord> *)this);
      if (qVar7 == 0) goto LAB_0021c7f9;
      pQVar4 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
               super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      lVar5 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
              super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
      pQVar6 = (args->d).d.ptr;
      (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
      pQVar4[lVar5].d.d.ptr = pQVar6;
LAB_0021c8c9:
      pqVar2 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0021c887;
    }
LAB_0021c7f9:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QDnsTlsAssociationRecord>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDnsTlsAssociationRecord> *)this);
      if (qVar7 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                 super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
        pQVar6 = (args->d).d.ptr;
        (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
        pQVar4[-1].d.d.ptr = pQVar6;
        ppQVar1 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                   super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0021c8c9;
      }
    }
  }
  pQVar6 = (args->d).d.ptr;
  (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
  bVar8 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
          super_QArrayDataPointer<QDnsTlsAssociationRecord>.size != 0;
  QArrayDataPointer<QDnsTlsAssociationRecord>::detachAndGrow
            ((QArrayDataPointer<QDnsTlsAssociationRecord> *)this,(uint)(i == 0 && bVar8),1,
             (QDnsTlsAssociationRecord **)0x0,(QArrayDataPointer<QDnsTlsAssociationRecord> *)0x0);
  if (i == 0 && bVar8) {
    local_38.d.d.ptr =
         (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
         (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0;
    (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
    super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr[-1].d.d.ptr = pQVar6;
    ppQVar1 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
               super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
              super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_60,(QArrayDataPointer<QDnsTlsAssociationRecord> *)this,i,1);
    local_38.d.d.ptr =
         (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
         (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0;
    ((local_60.displaceFrom)->d).d.ptr = pQVar6;
    local_60.displaceFrom = local_60.displaceFrom + 1;
    Inserter::~Inserter(&local_60);
  }
  QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord(&local_38);
LAB_0021c887:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }